

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

size_t units::findWordOperatorSep(string *ustring,string *keyword)

{
  size_type sVar1;
  char closeSegment;
  undefined8 in_RAX;
  size_type sVar2;
  byte *pbVar3;
  size_type sVar4;
  ulong __pos;
  int index;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (ustring,(keyword->_M_dataplus)._M_p,0xffffffffffffffff,
                     keyword->_M_string_length);
  __pos = ustring->_M_string_length;
  sVar4 = keyword->_M_string_length;
  if (sVar2 + sVar4 + 1 < __pos) {
    pbVar3 = (byte *)((ustring->_M_dataplus)._M_p + sVar2 + sVar4);
    while ((((sVar1 = sVar2, *pbVar3 - 0x2a < 0x35 &&
             ((0x10000000000021U >> ((ulong)(*pbVar3 - 0x2a) & 0x3f) & 1) != 0)) &&
            (sVar1 = 0xffffffffffffffff, sVar2 != 0)) &&
           (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::rfind(ustring,(keyword->_M_dataplus)._M_p,sVar2 - 1,sVar4),
           sVar2 != 0xffffffffffffffff))) {
      sVar4 = keyword->_M_string_length;
      pbVar3 = (byte *)((ustring->_M_dataplus)._M_p + sVar4 + sVar2);
    }
    sVar2 = sVar1;
    __pos = ustring->_M_string_length;
  }
  if (sVar2 != 0xffffffffffffffff) {
    do {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_last_of(ustring,")}]",__pos,3);
      if (sVar4 == 0xffffffffffffffff) {
        return sVar2;
      }
      if (sVar4 < sVar2) {
        return sVar2;
      }
      closeSegment = getMatchCharacter((ustring->_M_dataplus)._M_p[sVar4]);
      uStack_38 = CONCAT44((int)sVar4 + -2,(undefined4)uStack_38);
      segmentcheckReverse(ustring,closeSegment,(int *)((long)&uStack_38 + 4));
      __pos = (ulong)uStack_38._4_4_;
      if ((long)__pos < 0) {
        return 0xffffffffffffffff;
      }
      if (__pos < sVar2) {
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                rfind(ustring,(keyword->_M_dataplus)._M_p,__pos,keyword->_M_string_length);
      }
    } while (sVar2 != 0xffffffffffffffff);
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t
    findWordOperatorSep(const std::string& ustring, const std::string& keyword)
{
    auto sep = ustring.rfind(keyword);
    if (ustring.size() > sep + keyword.size() + 1) {
        auto keychar = ustring[sep + keyword.size()];
        while (keychar == '^' || keychar == '*' || keychar == '/') {
            if (sep == 0) {
                sep = std::string::npos;
                break;
            }
            sep = ustring.rfind(keyword, sep - 1);
            if (sep == std::string::npos) {
                break;
            }
            keychar = ustring[sep + keyword.size()];
        }
    }
    size_t findex = ustring.size();
    while (sep != std::string::npos) {
        auto lbrack = ustring.find_last_of(")}]", findex);

        if (lbrack == std::string::npos) {
            return sep;
        }
        if (lbrack < sep) {
            // this should not happen as it would mean the operator separator
            // didn't function properly
            return sep;  // LCOV_EXCL_LINE
        }
        auto cchar = getMatchCharacter(ustring[lbrack]);
        --lbrack;
        int index = static_cast<int>(lbrack) - 1;
        segmentcheckReverse(ustring, cchar, index);
        if (index < 0) {
            // this should not happen as it would mean we got this point by
            // bypassing some other checks
            return std::string::npos;  // LCOV_EXCL_LINE
        }
        findex = static_cast<size_t>(index);
        if (findex < sep) {
            sep = ustring.rfind(keyword, findex);
        }
    }
    return sep;
}